

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeUpper(SPxLPBase<double> *this,int i,double *newUpper,bool scale)

{
  double dVar1;
  double *pdVar2;
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar3;
  
  dVar1 = *newUpper;
  dVar3 = dVar1;
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    ::soplex::infinity::__tls_init();
    dVar3 = *newUpper;
    pdVar2 = (double *)__tls_get_addr(&PTR_003b4b70);
    if (dVar1 < *pdVar2) {
      (*this->lp_scaler->_vptr_SPxScaler[0x2c])(dVar3,this->lp_scaler,this,i);
      dVar3 = extraout_XMM0_Qa;
    }
  }
  (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar3;
  return;
}

Assistant:

virtual void changeUpper(int i, const R& newUpper, bool scale = false)
   {
      if(scale && newUpper < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::upper_w(i) = lp_scaler->scaleUpper(*this, i, newUpper);
      }
      else
         LPColSetBase<R>::upper_w(i) = newUpper;

      assert(isConsistent());
   }